

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderBarrier.cpp
# Opt level: O0

bool __thiscall
glcts::TessellationShaderBarrier1::verifyXFBBuffer(TessellationShaderBarrier1 *this,void *data)

{
  TestLog *this_00;
  MessageBuilder *pMVar1;
  TestError *this_01;
  MessageBuilder local_1b8;
  int local_34;
  int local_30;
  int retrieved_w;
  int retrieved_z;
  int retrieved_y;
  int retrieved_x;
  uint n_vertex;
  int *data_int;
  void *data_local;
  TessellationShaderBarrier1 *this_local;
  
  retrieved_y = 0;
  while( true ) {
    if (this->m_n_result_vertices <= (uint)retrieved_y) {
      return true;
    }
    retrieved_z = *(int *)((long)data + (ulong)(uint)(retrieved_y << 2) * 4);
    retrieved_w = *(int *)((long)data + (ulong)(retrieved_y * 4 + 1) * 4);
    local_30 = *(int *)((long)data + (ulong)(retrieved_y * 4 + 2) * 4);
    local_34 = *(int *)((long)data + (ulong)(retrieved_y * 4 + 3) * 4);
    if ((((retrieved_z != 1) || (retrieved_w != 1)) || (local_30 != 1)) || (local_34 != 1)) break;
    retrieved_y = retrieved_y + 1;
  }
  _retrieved_x = data;
  data_int = (int *)data;
  data_local = this;
  this_00 = tcu::TestContext::getLog
                      ((this->super_TessellationShaderBarrierTestCase).super_TestCaseBase.
                       super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1b8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<
                     (&local_1b8,(char (*) [46])"Invalid value returned: expected:[1, 1, 1, 1]");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [13])0x2b206db);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2c3fdfc);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&retrieved_z);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [3])0x2a4b1eb);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&retrieved_w);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [3])0x2a4b1eb);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_30);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [3])0x2a4b1eb);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_34);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1b8);
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Invalid rendering result",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderBarrier.cpp"
             ,0x1f8);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

bool TessellationShaderBarrier1::verifyXFBBuffer(const void* data)
{
	int* data_int = (int*)data;

	/* Run through all vertices */
	for (unsigned int n_vertex = 0; n_vertex < m_n_result_vertices; ++n_vertex)
	{
		int retrieved_x = data_int[n_vertex * 4];
		int retrieved_y = data_int[n_vertex * 4 + 1];
		int retrieved_z = data_int[n_vertex * 4 + 2];
		int retrieved_w = data_int[n_vertex * 4 + 3];

		if (retrieved_x != 1 || retrieved_y != 1 || retrieved_z != 1 || retrieved_w != 1)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Invalid value returned: expected:[1, 1, 1, 1]"
							   << " retrieved: "
							   << "[" << retrieved_x << ", " << retrieved_y << ", " << retrieved_z << ", "
							   << retrieved_w << tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid rendering result");
		}
	}

	return true;
}